

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

int Abc_NtkDontCareSimulate(Odc_Man_t *p,uint *puTruth)

{
  Odc_Lit_t OVar1;
  int iVar2;
  uint *q;
  uint *puTruth_local;
  Odc_Man_t *p_local;
  
  Odc_ManIncrementTravId(p);
  OVar1 = Odc_Regular(p->iRoot);
  Abc_NtkDontCareSimulate_rec(p,OVar1);
  OVar1 = Odc_Regular(p->iRoot);
  q = Odc_ObjTruth(p,OVar1);
  Abc_InfoCopy(puTruth,q,p->nWords);
  iVar2 = Odc_IsComplement(p->iRoot);
  if (iVar2 != 0) {
    Abc_InfoNot(puTruth,p->nWords);
  }
  iVar2 = Extra_TruthCountOnes(puTruth,p->nVarsMax);
  return iVar2;
}

Assistant:

int Abc_NtkDontCareSimulate( Odc_Man_t * p, unsigned * puTruth )
{
    Odc_ManIncrementTravId( p );
    Abc_NtkDontCareSimulate_rec( p, Odc_Regular(p->iRoot) );
    Abc_InfoCopy( puTruth, Odc_ObjTruth(p, Odc_Regular(p->iRoot)), p->nWords );
    if ( Odc_IsComplement(p->iRoot) )
        Abc_InfoNot( puTruth, p->nWords );
    return Extra_TruthCountOnes( puTruth, p->nVarsMax );
}